

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O3

int Test_N_VDotProd(N_Vector X,N_Vector Y,sunindextype param_3,int myid)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  double dVar6;
  timespec spec;
  timespec local_40;
  
  lVar2 = N_VGetLength();
  N_VConst(0x4000000000000000,X);
  N_VConst(0x3fe0000000000000,Y);
  clock_gettime(1,&local_40);
  lVar3 = local_40.tv_sec - base_time_tv_sec;
  dVar6 = (double)local_40.tv_nsec;
  uVar5 = N_VDotProd(X,Y);
  sync_device(X);
  clock_gettime(1,&local_40);
  lVar4 = local_40.tv_sec - base_time_tv_sec;
  iVar1 = SUNRCompare(uVar5,(double)lVar2);
  if (iVar1 == 0) {
    iVar1 = 0;
    if (myid == 0) {
      puts("PASSED test -- N_VDotProd ");
      iVar1 = 0;
    }
  }
  else {
    printf(">>> FAILED test -- N_VDotProd, Proc %d \n",(ulong)(uint)myid);
    iVar1 = 1;
  }
  max_time(X,((double)local_40.tv_nsec / 1000000000.0 + (double)lVar4) -
             (dVar6 / 1000000000.0 + (double)lVar3));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VDotProd");
  }
  return iVar1;
}

Assistant:

int Test_N_VDotProd(N_Vector X, N_Vector Y, sunindextype local_length, int myid)
{
  int fails = 0, failure = 0;
  double start_time, stop_time, maxt;
  sunindextype global_length;
  sunrealtype ans;

  /* get global length */
  global_length = N_VGetLength(X);

  /* fill vector data */
  N_VConst(TWO, X);
  N_VConst(HALF, Y);

  start_time = get_time();
  ans        = N_VDotProd(X, Y);
  sync_device(X);
  stop_time = get_time();

  /* ans should equal global vector length */
  failure = SUNRCompare(ans, (sunrealtype)global_length);

  if (failure)
  {
    printf(">>> FAILED test -- N_VDotProd, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VDotProd \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VDotProd", maxt);

  return (fails);
}